

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorCreatedBeforeStartTimeFixtureinitiatorLogonAtStartTimeHelper::
~initiatorCreatedBeforeStartTimeFixtureinitiatorLogonAtStartTimeHelper
          (initiatorCreatedBeforeStartTimeFixtureinitiatorLogonAtStartTimeHelper *this)

{
  initiatorCreatedBeforeStartTimeFixture::~initiatorCreatedBeforeStartTimeFixture
            ((initiatorCreatedBeforeStartTimeFixture *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorCreatedBeforeStartTimeFixture, initiatorLogonAtStartTime)
{
  process_sleep( STARTTIMEFROMNOW );

  CHECK_EQUAL( 0, toLogon );
  CHECK_EQUAL( 0, actuallySent);
  CHECK_EQUAL( false, actuallySentLogon);

  object->setResponder( this );
  object->next();

  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 1, actuallySent);
  CHECK_EQUAL( true, actuallySentLogon);
}